

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Vector<unsigned_long>::~Vector(Vector<unsigned_long> *this)

{
  unsigned_long *puVar1;
  RemoveConst<unsigned_long> *pRVar2;
  unsigned_long *puVar3;
  ArrayDisposer *pAVar4;
  
  puVar1 = (this->builder).ptr;
  if (puVar1 != (unsigned_long *)0x0) {
    pRVar2 = (this->builder).pos;
    puVar3 = (this->builder).endPtr;
    (this->builder).ptr = (unsigned_long *)0x0;
    (this->builder).pos = (RemoveConst<unsigned_long> *)0x0;
    (this->builder).endPtr = (unsigned_long *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,puVar1,8,(long)pRVar2 - (long)puVar1 >> 3,(long)puVar3 - (long)puVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }